

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool __thiscall
ON_Brep::CollapseEdge(ON_Brep *this,int edge_index,bool bCloseTrimGap,int vertex_index)

{
  int vertex_index_00;
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ON_BrepEdge *edge_00;
  ON_BrepVertex *pOVar7;
  int *piVar8;
  ON_BrepTrim *pOVar9;
  ON_BrepTrim *trim0;
  ON_BrepTrim *trim1;
  ON_BrepVertex *V1;
  ON_BrepVertex *V0;
  ON_BrepTrim *next_trim;
  ON_BrepTrim *prev_trim;
  ON_BrepTrim *trim_1;
  ON_BrepTrim *trim;
  int eti;
  int i;
  ON_SimpleArray<int> next_ti;
  ON_SimpleArray<int> prev_ti;
  undefined1 local_78 [8];
  ON_SimpleArray<int> li;
  ON_SimpleArray<int> ti;
  int trim_count;
  ON_BrepVertex *vertex;
  int orig_vid1;
  int orig_vid0;
  ON_BrepEdge *edge;
  int vertex_index_local;
  bool bCloseTrimGap_local;
  int edge_index_local;
  ON_Brep *this_local;
  
  edge_00 = Edge(this,edge_index);
  if (edge_00 == (ON_BrepEdge *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    iVar6 = edge_00->m_vi[0];
    vertex_index_00 = edge_00->m_vi[1];
    edge._4_4_ = vertex_index;
    if (vertex_index == -1) {
      edge._4_4_ = edge_00->m_vi[0];
    }
    pOVar7 = Vertex(this,edge._4_4_);
    if (pOVar7 == (ON_BrepVertex *)0x0) {
      this_local._7_1_ = 0;
    }
    else {
      iVar5 = pOVar7->m_vertex_index;
      iVar3 = ON_SimpleArray<int>::Count(&edge_00->m_ti);
      if (0 < iVar3) {
        ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)&li.m_count,(long)iVar3);
        ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)local_78,(long)iVar3);
        ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)&next_ti.m_count,(long)iVar3);
        ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)&eti,(long)iVar3);
        for (trim._0_4_ = 0; (int)trim < iVar3; trim._0_4_ = (int)trim + 1) {
          piVar8 = ON_SimpleArray<int>::operator[](&edge_00->m_ti,(int)trim);
          iVar1 = *piVar8;
          trim._4_4_ = iVar1;
          if ((-1 < iVar1) &&
             (iVar4 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T),
             iVar1 < iVar4)) {
            pOVar9 = ON_ClassArray<ON_BrepTrim>::operator[]
                               ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,trim._4_4_);
            if (pOVar9->m_trim_index != trim._4_4_) {
              this_local._7_1_ = 0;
              bVar2 = true;
              goto LAB_00576b88;
            }
            if ((pOVar9->m_li < 0) ||
               (iVar1 = pOVar9->m_li,
               iVar4 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L),
               iVar4 <= iVar1)) {
              this_local._7_1_ = 0;
              bVar2 = true;
              goto LAB_00576b88;
            }
            trim._4_4_ = PrevTrim(this,pOVar9->m_trim_index);
            if ((trim._4_4_ < 0) || (trim._4_4_ == pOVar9->m_trim_index)) {
              this_local._7_1_ = 0;
              bVar2 = true;
              goto LAB_00576b88;
            }
            ON_SimpleArray<int>::Append
                      ((ON_SimpleArray<int> *)&next_ti.m_count,(int *)((long)&trim + 4));
            trim._4_4_ = NextTrim(this,pOVar9->m_trim_index);
            if ((trim._4_4_ < 0) || (trim._4_4_ == pOVar9->m_trim_index)) {
              this_local._7_1_ = 0;
              bVar2 = true;
              goto LAB_00576b88;
            }
            ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)&eti,(int *)((long)&trim + 4));
            ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)&li.m_count,&pOVar9->m_trim_index);
            ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)local_78,&pOVar9->m_li);
          }
        }
        ChangeVertex(this,edge_00->m_vi[0],iVar5,true);
        ChangeVertex(this,edge_00->m_vi[1],iVar5,true);
        iVar5 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)&li.m_count);
        for (trim._0_4_ = 0; (int)trim < iVar5; trim._0_4_ = (int)trim + 1) {
          piVar8 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)&li.m_count,(int)trim);
          trim._4_4_ = *piVar8;
          pOVar9 = ON_ClassArray<ON_BrepTrim>::operator[]
                             ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,trim._4_4_);
          piVar8 = ON_SimpleArray<int>::operator[]
                             ((ON_SimpleArray<int> *)&next_ti.m_count,(int)trim);
          trim0 = ON_ClassArray<ON_BrepTrim>::operator[]
                            ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,*piVar8);
          piVar8 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)&eti,(int)trim);
          trim1 = ON_ClassArray<ON_BrepTrim>::operator[]
                            ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,*piVar8);
          DeleteTrim(this,pOVar9,false);
          if (bCloseTrimGap) {
            CloseTrimGap(this,trim0,trim1);
          }
        }
        bVar2 = false;
LAB_00576b88:
        ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)&eti);
        ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)&next_ti.m_count);
        ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)local_78);
        ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)&li.m_count);
        if (bVar2) goto LAB_00576c86;
      }
      DeleteEdge(this,edge_00,false);
      pOVar7 = Vertex(this,iVar6);
      if ((pOVar7 != (ON_BrepVertex *)0x0) && (iVar6 = ON_BrepVertex::EdgeCount(pOVar7), iVar6 == 0)
         ) {
        DeleteVertex(this,pOVar7);
      }
      pOVar7 = Vertex(this,vertex_index_00);
      if ((pOVar7 != (ON_BrepVertex *)0x0) && (iVar6 = ON_BrepVertex::EdgeCount(pOVar7), iVar6 == 0)
         ) {
        DeleteVertex(this,pOVar7);
      }
      this_local._7_1_ = 1;
    }
  }
LAB_00576c86:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ON_Brep::CollapseEdge( int edge_index, bool bCloseTrimGap, int vertex_index  )
{
  ON_BrepEdge* edge = Edge(edge_index);
  if ( 0 == edge )
    return false;
  edge_index = edge->m_edge_index; // clear high bit

  int orig_vid0 = edge->m_vi[0];
  int orig_vid1 = edge->m_vi[1];

  if ( -1 == vertex_index )
    vertex_index = edge->m_vi[0];
  ON_BrepVertex* vertex = Vertex(vertex_index);
  if ( 0 == vertex )
    return false;
  vertex_index = vertex->m_vertex_index; // clear high bit

  int trim_count = edge->m_ti.Count();
  if ( trim_count > 0 )
  {
    ON_SimpleArray<int> ti(trim_count);
    ON_SimpleArray<int> li(trim_count);
    ON_SimpleArray<int> prev_ti(trim_count);
    ON_SimpleArray<int> next_ti(trim_count);
    int i, eti;
    for ( eti = 0; eti < trim_count; eti++ )
    {
      i = edge->m_ti[eti];
      if ( i < 0 || i >= m_T.Count() )
        continue;
      const ON_BrepTrim& trim = m_T[i];
      if ( trim.m_trim_index != i )
        return false;
      if ( trim.m_li < 0 || trim.m_li >= m_L.Count() )
        return false;
      i = PrevTrim(trim.m_trim_index);
      if ( i < 0 || i == trim.m_trim_index )
        return false;
      prev_ti.Append(i);
      i = NextTrim(trim.m_trim_index);
      if ( i < 0 || i == trim.m_trim_index )
        return false;
      next_ti.Append(i);
      ti.Append(trim.m_trim_index);
      li.Append(trim.m_li);
    }

    ChangeVertex(edge->m_vi[0], vertex_index, true);
    ChangeVertex(edge->m_vi[1], vertex_index, true);
    
    trim_count = ti.Count();
    for ( eti = 0; eti < trim_count; eti++ )
    {
      i = ti[eti];
      ON_BrepTrim& trim = m_T[i];
      //ON_BrepLoop& loop = m_L[li[eti]];
      ON_BrepTrim& prev_trim = m_T[prev_ti[eti]];
      ON_BrepTrim& next_trim = m_T[next_ti[eti]];
      DeleteTrim(trim,false);
      if ( bCloseTrimGap )
        CloseTrimGap(prev_trim,next_trim);
    }
  }

  DeleteEdge(*edge,false);
  ON_BrepVertex* V0 = Vertex(orig_vid0);
  if (V0 && V0->EdgeCount() == 0)
    DeleteVertex(*V0);
  ON_BrepVertex* V1 = Vertex(orig_vid1);
  if (V1 && V1->EdgeCount() == 0)
    DeleteVertex(*V1);
  return true;
}